

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O2

void __thiscall
Arcflow::lift_state(Arcflow *this,vector<int,_std::allocator<int>_> *valid_opts,
                   vector<int,_std::allocator<int>_> *u,int it,int ic)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  long lVar7;
  int *piVar8;
  const_iterator __end4;
  long *plVar9;
  long lVar10;
  const_iterator __begin4;
  int *piVar11;
  vector<int,_std::allocator<int>_> caps;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> space;
  int local_9c;
  _Vector_base<int,_std::allocator<int>_> local_98;
  long local_78;
  long local_70;
  vector<int,_std::allocator<int>_> *local_68;
  _Vector_base<int,_std::allocator<int>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  if (it < (this->inst).nsizes) {
    local_68 = valid_opts;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_48,(long)(this->inst).ndims,
               (allocator_type *)&local_60);
    piVar2 = (this->maxW).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (u->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    for (lVar7 = 0; lVar7 < (this->inst).ndims; lVar7 = lVar7 + 1) {
      local_48._M_impl.super__Vector_impl_data._M_start[lVar7] = piVar2[lVar7] - piVar3[lVar7];
    }
    count_max_rep((vector<int,_std::allocator<int>_> *)&local_60,this,
                  (vector<int,_std::allocator<int>_> *)&local_48,it,ic);
    local_70 = (long)it;
    local_78 = local_70 * 0x18;
    for (lVar7 = 0; lVar7 < (this->inst).ndims; lVar7 = lVar7 + 1) {
      iVar6 = (this->maxW).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      piVar4 = (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      piVar11 = (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      for (piVar8 = piVar11; piVar8 != piVar4; piVar8 = piVar8 + 1) {
        iVar1 = *(int *)(*(long *)&(this->inst).Ws.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[*piVar8].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + lVar7 * 4);
        if (iVar1 < iVar6) {
          iVar6 = iVar1;
        }
      }
      piVar2 = (u->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      iVar1 = piVar2[lVar7];
      if (iVar1 != iVar6) {
        plVar9 = (long *)((long)&(((this->weights).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data + local_78);
        lVar10 = local_70;
        for (; (lVar10 < (this->inst).nsizes && (iVar1 <= iVar6));
            iVar6 = iVar6 - *(int *)(lVar5 + lVar7 * 4) * *piVar8) {
          lVar5 = *plVar9;
          piVar8 = local_60._M_impl.super__Vector_impl_data._M_start + lVar10;
          lVar10 = lVar10 + 1;
          plVar9 = plVar9 + 3;
        }
        if (iVar6 < iVar1) {
          local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_98._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
          local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (; piVar11 != piVar4; piVar11 = piVar11 + 1) {
            local_9c = *(int *)(*(long *)&(this->inst).Ws.
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[*piVar11].
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data + lVar7 * 4) -
                       (u->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar7];
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      ((vector<int,_std::allocator<int>_> *)&local_98,&local_9c);
          }
          if (4 < (ulong)((long)local_98._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_98._M_impl.super__Vector_impl_data._M_start)) {
            std::
            __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      ();
            __first = std::
                      __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                                (local_98._M_impl.super__Vector_impl_data._M_start,
                                 local_98._M_impl.super__Vector_impl_data._M_finish);
            std::vector<int,_std::allocator<int>_>::erase
                      ((vector<int,_std::allocator<int>_> *)&local_98,
                       (const_iterator)__first._M_current,
                       (const_iterator)local_98._M_impl.super__Vector_impl_data._M_finish);
          }
          iVar6 = min_slack(this,(vector<int,_std::allocator<int>_> *)&local_60,it,(int)lVar7,
                            (vector<int,_std::allocator<int>_> *)&local_98);
          piVar11 = (u->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start + lVar7;
          *piVar11 = *piVar11 + iVar6;
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_98);
        }
        else {
          piVar2[lVar7] = iVar6;
        }
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void Arcflow::lift_state(const std::vector<int> &valid_opts, std::vector<int> &u, int it,
						 int ic) const {
	if (it >= inst.nsizes) {
		return;
	}
	std::vector<int> space(inst.ndims);
	for (int d = 0; d < inst.ndims; d++) {
		space[d] = maxW[d] - u[d];
	}
	const std::vector<int> &r = count_max_rep(space, it, ic);
	for (int d = 0; d < inst.ndims; d++) {
		int minw = maxW[d];
		for (int t : valid_opts) {
			minw = std::min(minw, inst.Ws[t][d]);
		}
		if (u[d] != minw) {
			// lift method 1
			int maxpos = minw;
			for (int i = it; i < inst.nsizes && maxpos >= u[d]; i++) {
				maxpos -= r[i] * weights[i][d];
			}
			if (maxpos >= u[d]) {
				u[d] = maxpos;
			} else {
				// lift method 2
				std::vector<int> caps;
				for (int t : valid_opts) {
					caps.push_back(inst.Ws[t][d] - u[d]);
				}
				if (caps.size() > 1) {
					sort(all(caps));
					caps.erase(unique(all(caps)), caps.end());
				}
				u[d] += min_slack(r, it, d, caps);
			}
		}
	}
}